

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodeparse.y
# Opt level: O1

int pcodeparseerror(char *s)

{
  PcodeSnippet *pPVar1;
  allocator local_31;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  pPVar1 = pcode;
  std::__cxx11::string::string((string *)local_30,s,&local_31);
  (*(pPVar1->super_PcodeCompile)._vptr_PcodeCompile[5])(pPVar1,0,(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return 0;
}

Assistant:

int yyerror(const char *s)

{
  pcode->reportError((const Location *)0,s);
  return 0;
}